

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.h
# Opt level: O1

cbtScalar __thiscall
cbtCollisionWorld::ClosestRayResultCallback::addSingleResult
          (ClosestRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  float fVar3;
  cbtCollisionObject *pcVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined3 in_register_00000011;
  
  (this->super_RayResultCallback).m_closestHitFraction = rayResult->m_hitFraction;
  pcVar4 = rayResult->m_collisionObject;
  (this->super_RayResultCallback).m_collisionObject = pcVar4;
  if (CONCAT31(in_register_00000011,normalInWorldSpace) == 0) {
    cVar1 = (rayResult->m_hitNormalLocal).m_floats[0];
    fVar3 = (rayResult->m_hitNormalLocal).m_floats[1];
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pcVar4->m_worldTransform).m_basis.m_el[0].
                                                    m_floats[1])),ZEXT416((uint)cVar1),
                             ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[0].m_floats[0]));
    cVar2 = (rayResult->m_hitNormalLocal).m_floats[2];
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[0].m_floats[2]));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pcVar4->m_worldTransform).m_basis.m_el[1].
                                                    m_floats[1])),ZEXT416((uint)cVar1),
                             ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[1].m_floats[0]));
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[1].m_floats[2]));
    auVar7 = vinsertps_avx(auVar7,auVar6,0x10);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pcVar4->m_worldTransform).m_basis.m_el[2].
                                                    m_floats[1])),ZEXT416((uint)cVar1),
                             ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[2].m_floats[0]));
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[2].m_floats[2]));
    auVar7 = vinsertps_avx(auVar7,auVar6,0x28);
    *(undefined1 (*) [16])(this->m_hitNormalWorld).m_floats = auVar7;
  }
  else {
    uVar8 = *(undefined8 *)((rayResult->m_hitNormalLocal).m_floats + 2);
    *(undefined8 *)(this->m_hitNormalWorld).m_floats =
         *(undefined8 *)(rayResult->m_hitNormalLocal).m_floats;
    *(undefined8 *)((this->m_hitNormalWorld).m_floats + 2) = uVar8;
  }
  fVar3 = rayResult->m_hitFraction;
  fVar5 = 1.0 - fVar3;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->m_rayToWorld).m_floats[0])),
                           ZEXT416((uint)fVar5),
                           ZEXT416(*(uint *)&(this->super_RayResultCallback).field_0x24));
  (this->m_hitPointWorld).m_floats[0] = auVar7._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->m_rayToWorld).m_floats[1])),
                           ZEXT416((uint)fVar5),ZEXT416(*(uint *)&this->field_0x28));
  (this->m_hitPointWorld).m_floats[1] = auVar7._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->m_rayToWorld).m_floats[2])),
                           ZEXT416((uint)fVar5),ZEXT416(*(uint *)&this->field_0x2c));
  (this->m_hitPointWorld).m_floats[2] = auVar7._0_4_;
  return rayResult->m_hitFraction;
}

Assistant:

virtual cbtScalar addSingleResult(LocalRayResult& rayResult, bool normalInWorldSpace)
		{
			//caller already does the filter on the m_closestHitFraction
			cbtAssert(rayResult.m_hitFraction <= m_closestHitFraction);

			m_closestHitFraction = rayResult.m_hitFraction;
			m_collisionObject = rayResult.m_collisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = rayResult.m_hitNormalLocal;
			}
			else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_collisionObject->getWorldTransform().getBasis() * rayResult.m_hitNormalLocal;
			}
			m_hitPointWorld.setInterpolate3(m_rayFromWorld, m_rayToWorld, rayResult.m_hitFraction);
			return rayResult.m_hitFraction;
		}